

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O0

void train(void)

{
  vw *_dict;
  ostream *poVar1;
  bool in_stack_0000000f;
  vw *in_stack_00000010;
  size_t pass;
  Generator gen;
  vw *vw_obj;
  string init_str;
  char *in_stack_00000108;
  Trie dict;
  size_t in_stack_00000278;
  undefined1 in_stack_00000287;
  char *in_stack_00000288;
  Generator *in_stack_00000290;
  vw *vw_obj_00;
  Generator *this;
  ulong local_128;
  void *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  io_buf *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string local_d8 [32];
  vw *local_b8;
  undefined1 local_a9 [56];
  undefined1 local_71 [113];
  
  load_dictionary(in_stack_00000108);
  this = (Generator *)local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_71 + 1),"",(allocator *)this);
  Trie::build_max((Trie *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                  in_stack_fffffffffffffef8);
  std::__cxx11::string::~string((string *)(local_71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  vw_obj_00 = (vw *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_a9 + 1),
             "--search 29 -b 28 --quiet --search_task hook --ring_size 1024 --search_rollin learn --search_rollout none -q i: --ngram i15 --skips i5 --ngram c15 --ngram w6 --skips c3 --skips w3"
             ,(allocator *)vw_obj_00);
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  std::__cxx11::string::string(local_d8,(string *)(local_a9 + 1));
  _dict = VW::initialize(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         (bool)in_stack_ffffffffffffff07,(trace_message_t)in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_d8);
  local_b8 = _dict;
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)(local_a9 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Generator::Generator(this,vw_obj_00,(Trie *)_dict);
  for (local_128 = 1; local_128 < 0x15; local_128 = local_128 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"===== pass ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_128);
    poVar1 = std::operator<<(poVar1," =====");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    run_istream(in_stack_00000290,in_stack_00000288,(bool)in_stack_00000287,in_stack_00000278);
    run_istream(in_stack_00000290,in_stack_00000288,(bool)in_stack_00000287,in_stack_00000278);
    run_istream(in_stack_00000290,in_stack_00000288,(bool)in_stack_00000287,in_stack_00000278);
  }
  VW::finish(in_stack_00000010,in_stack_0000000f);
  Generator::~Generator((Generator *)0x11c0b7);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  Trie::~Trie((Trie *)_dict);
  return;
}

Assistant:

void train()
{ // initialize VW as usual, but use 'hook' as the search_task
  Trie dict = load_dictionary("phrase-table.vocab");
  dict.build_max();
  //dict.print();

  string init_str("--search 29 -b 28 --quiet --search_task hook --ring_size 1024 --search_rollin learn --search_rollout none -q i: --ngram i15 --skips i5 --ngram c15 --ngram w6 --skips c3 --skips w3"); //  --search_use_passthrough_repr"); // -q si -q wi -q ci -q di  -f my_model
  vw& vw_obj = *VW::initialize(init_str);
  cerr << init_str << endl;
  Generator gen(vw_obj, nullptr); // &dict);
  for (size_t pass=1; pass<=20; pass++)
  { cerr << "===== pass " << pass << " =====" << endl;
    run_istream(gen, "phrase-table.tr", true);
    run_istream(gen, "phrase-table.tr", false, 300000);
    run_istream(gen, "phrase-table.te", false, 100000);
  }
  VW::finish(vw_obj);
}